

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O1

void __thiscall
reflect::TypeDescriptor_Struct::TypeDescriptor_Struct
          (TypeDescriptor_Struct *this,_func_void_TypeDescriptor_Struct_ptr *init)

{
  (this->super_TypeDescriptor).name = (char *)0x0;
  (this->super_TypeDescriptor).size = 0;
  (this->super_TypeDescriptor)._vptr_TypeDescriptor =
       (_func_int **)&PTR__TypeDescriptor_Struct_00106c68;
  (this->members).
  super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members).
  super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members).
  super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*init)(this);
  return;
}

Assistant:

TypeDescriptor(const char* name, size_t size) : name{name}, size{size} {}